

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O1

DdNode * Cudd_addWalsh(DdManager *dd,DdNode **x,DdNode **y,int n)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n_00;
  DdNode *pDVar6;
  DdNode *g;
  long lVar7;
  long lVar8;
  
  iVar3 = n + -1;
  do {
    dd->reordered = 0;
    pDVar6 = dd->one;
    if (n != 0) {
      pDVar4 = cuddUniqueConst(dd,-1.0);
      if (pDVar4 == (DdNode *)0x0) {
LAB_007bb762:
        pDVar6 = (DdNode *)0x0;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar5 = Cudd_addIte(dd,y[iVar3],pDVar4,pDVar6);
        if (pDVar5 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar4);
        }
        else {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          n_00 = Cudd_addIte(dd,x[iVar3],pDVar5,pDVar6);
          if (n_00 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar5);
            if (n < 2) {
              pDVar5 = (DdNode *)0x0;
            }
            else {
              pDVar6 = Cudd_addIte(dd,y[iVar3],pDVar6,pDVar4);
              if (pDVar6 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar4);
                Cudd_RecursiveDeref(dd,n_00);
                goto LAB_007bb762;
              }
              piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar5 = Cudd_addIte(dd,x[iVar3],pDVar6,pDVar4);
              if (pDVar5 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar4);
                Cudd_RecursiveDeref(dd,n_00);
                Cudd_RecursiveDeref(dd,pDVar6);
                pDVar6 = (DdNode *)0x0;
                goto LAB_007bb7f0;
              }
              piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,pDVar6);
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            pDVar6 = n_00;
            lVar7 = (ulong)(n - 2) + 1;
            if (1 < n) {
              do {
                pDVar4 = Cudd_addIte(dd,y[lVar7 + -1],pDVar5,n_00);
                if (pDVar4 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,n_00);
LAB_007bb7df:
                  Cudd_RecursiveDeref(dd,pDVar5);
                  pDVar6 = (DdNode *)0x0;
                  goto LAB_007bb7f0;
                }
                piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                pDVar6 = Cudd_addIte(dd,x[lVar7 + -1],pDVar4,n_00);
                if (pDVar6 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,n_00);
                  Cudd_RecursiveDeref(dd,pDVar5);
                  pDVar5 = pDVar4;
                  goto LAB_007bb7df;
                }
                piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDeref(dd,pDVar4);
                pDVar4 = pDVar5;
                if (lVar7 != 1) {
                  g = Cudd_addIte(dd,y[lVar7 + -1],n_00,pDVar5);
                  if (g == (DdNode *)0x0) {
                    Cudd_RecursiveDeref(dd,n_00);
                    Cudd_RecursiveDeref(dd,pDVar5);
                    pDVar5 = pDVar6;
                    goto LAB_007bb7df;
                  }
                  piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  pDVar4 = Cudd_addIte(dd,x[lVar7 + -1],g,pDVar5);
                  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_RecursiveDeref(dd,g);
                }
                Cudd_RecursiveDeref(dd,n_00);
                Cudd_RecursiveDeref(dd,pDVar5);
                lVar8 = lVar7 + -1;
                bVar2 = 0 < lVar7;
                n_00 = pDVar6;
                lVar7 = lVar8;
                pDVar5 = pDVar4;
              } while (lVar8 != 0 && bVar2);
            }
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            goto LAB_007bb7f0;
          }
          Cudd_RecursiveDeref(dd,pDVar4);
          Cudd_RecursiveDeref(dd,pDVar5);
        }
        pDVar6 = (DdNode *)0x0;
      }
    }
LAB_007bb7f0:
    if (dd->reordered != 1) {
      return pDVar6;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addWalsh(
  DdManager * dd,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = addWalshInt(dd, x, y, n);
    } while (dd->reordered == 1);
    return(res);

}